

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

slab * slab_split(slab_cache *cache,slab *slab)

{
  byte bVar1;
  uint8_t order;
  size_t size;
  slab *slab_00;
  rlist *prVar2;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  slab *buddy;
  size_t new_size;
  uint8_t new_order;
  slab *slab_local;
  slab_cache *cache_local;
  
  if (slab->order != '\0') {
    order = slab->order + 0xff;
    size = slab_order_size(cache,order);
    slab_create(slab,order,size);
    slab_00 = slab_buddy(cache,slab);
    slab_create(slab_00,order,size);
    bVar1 = slab_00->order;
    prVar2 = &slab_00->next_in_list;
    prVar2->prev = &cache->orders[bVar1].slabs;
    (slab_00->next_in_list).next = cache->orders[bVar1].slabs.next;
    prVar2->prev->next = prVar2;
    ((slab_00->next_in_list).next)->prev = prVar2;
    cache->orders[slab_00->order].stats.total =
         slab_00->size + cache->orders[slab_00->order].stats.total;
    return slab;
  }
  __assert_fail("slab->order > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,0x8d,"struct slab *slab_split(struct slab_cache *, struct slab *)");
}

Assistant:

static inline struct slab *
slab_split(struct slab_cache *cache, struct slab *slab)
{
	assert(slab->order > 0);

	uint8_t new_order = slab->order - 1;
	size_t new_size = slab_order_size(cache, new_order);

	slab_create(slab, new_order, new_size);

	struct slab *buddy = slab_buddy(cache, slab);
	VALGRIND_MAKE_MEM_UNDEFINED(buddy, sizeof(*buddy));
	slab_create(buddy, new_order, new_size);
	slab_list_add(&cache->orders[buddy->order], buddy, next_in_list);

	return slab;
}